

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimgrb.cpp
# Opt level: O1

void vm_rewrite_image(CVmFile *origfp,CVmFile *newfp,ulong static_cs_ofs)

{
  uchar uVar1;
  uchar xor_mask;
  uint32_t tmp;
  CVmImageWriter *this;
  CVmConstMapper *this_00;
  long lVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  size_t buflen;
  char cpdf_buf [20];
  char buf [4096];
  short local_1078;
  uint local_1076;
  uint local_1072;
  CVmFile *local_1060;
  CVmFile *local_1058;
  ulong local_1050;
  ulong local_1048;
  undefined8 local_1040;
  int local_1038;
  uint local_1034;
  
  this = (CVmImageWriter *)operator_new(0x70);
  CVmImageWriter::CVmImageWriter(this,newfp);
  this_00 = (CVmConstMapper *)operator_new(0x48);
  CVmConstMapper::CVmConstMapper(this_00);
  CVmUndo::drop_undo(G_undo_X);
  sp_ = sp_ + -(long)(int)((ulong)((long)sp_ - (long)G_interpreter_X.super_CVmStack.arr_) >> 4);
  CVmObjTable::gc_full(&G_obj_table_X);
  CVmObjTable::add_metadeps_for_instances(&G_obj_table_X);
  CVmObjTable::rebuild_image_convert_const_data(&G_obj_table_X,this_00);
  CVmFile::read_bytes(origfp,(char *)&local_1038,0x45);
  CVmFile::write_bytes(newfp,(char *)&local_1038,0x45);
  xor_mask = 0xef;
  local_1040 = 0;
  local_1048 = 0;
  local_1060 = newfp;
  local_1058 = origfp;
  local_1050 = static_cs_ofs;
  do {
    CVmFile::read_bytes(origfp,(char *)&local_1038,10);
    uVar4 = (ulong)local_1034;
    if (((local_1038 == 0x444c434d) || (local_1038 == 0x534a424f)) || (local_1038 == 0x494e4953)) {
      lVar2 = ftell((FILE *)origfp->fp_);
      fseek((FILE *)origfp->fp_,uVar4 + lVar2,0);
    }
    else if (local_1038 == 0x46445043) {
      CVmFile::read_bytes(origfp,(char *)&local_1078,10);
      if (local_1078 == 2) {
        local_1076 = local_1076 + (int)this_00->pages_cnt_;
      }
      if (local_1078 == 1 && static_cs_ofs != 0) {
        local_1048 = (ulong)local_1072;
        local_1076 = (uint)(static_cs_ofs / local_1048);
      }
      CVmFile::write_bytes(newfp,(char *)&local_1038,10);
      CVmFile::write_bytes(newfp,(char *)&local_1078,10);
    }
    else {
      uVar1 = xor_mask;
      if (local_1038 == 0x47505043) {
        lVar3 = ftell((FILE *)origfp->fp_);
        lVar2 = origfp->seek_base_;
        CVmFile::read_bytes(origfp,(char *)&local_1078,7);
        fseek((FILE *)origfp->fp_,(lVar3 - lVar2) + origfp->seek_base_,0);
        uVar1 = (uchar)local_1072;
        if (local_1078 != 2) {
          uVar1 = xor_mask;
        }
        newfp = local_1060;
        if (((static_cs_ofs != 0) && (local_1078 == 1)) &&
           (static_cs_ofs <= local_1076 * local_1048)) {
          lVar2 = ftell((FILE *)origfp->fp_);
          fseek((FILE *)origfp->fp_,uVar4 + lVar2,0);
          newfp = local_1060;
          xor_mask = uVar1;
          goto LAB_001e6971;
        }
      }
      else if (local_1038 == 0x20464f45) {
        CVmMetaTable::rebuild_image(G_meta_table_X,this);
        if (G_meta_table_X->count_ != 0) {
          uVar6 = 0;
          do {
            iVar5 = 2;
            do {
              CVmObjTable::rebuild_image(&G_obj_table_X,(int)uVar6,this,this_00,(uint)(iVar5 == 1));
              iVar5 = iVar5 + -1;
            } while (iVar5 != 0);
            uVar6 = uVar6 + 1;
          } while (uVar6 < G_meta_table_X->count_);
        }
        CVmConstMapper::write_to_image_file(this_00,this,xor_mask);
        local_1040 = 1;
        static_cs_ofs = local_1050;
        origfp = local_1058;
        newfp = local_1060;
      }
      CVmFile::write_bytes(newfp,(char *)&local_1038,10);
      xor_mask = uVar1;
      if (uVar4 != 0) {
        do {
          buflen = 0x1000;
          if (uVar4 < 0x1000) {
            buflen = uVar4;
          }
          CVmFile::read_bytes(local_1058,(char *)&local_1038,buflen);
          CVmFile::write_bytes(newfp,(char *)&local_1038,buflen);
          uVar4 = uVar4 - buflen;
          static_cs_ofs = local_1050;
          origfp = local_1058;
        } while (uVar4 != 0);
      }
    }
LAB_001e6971:
    if ((int)local_1040 != 0) {
      CVmImageWriter::~CVmImageWriter(this);
      operator_delete(this,0x70);
      CVmConstMapper::~CVmConstMapper(this_00);
      operator_delete(this_00,0x48);
      return;
    }
  } while( true );
}

Assistant:

void vm_rewrite_image(VMG_ CVmFile *origfp, CVmFile *newfp,
                      ulong static_cs_ofs)
{
    char buf[4096];
    int done;
    CVmImageWriter *writer;
    CVmConstMapper *const_mapper;
    uchar xor_mask;
    ulong code_page_size;

    /* we don't know the code page size yet */
    code_page_size = 0;

    /* choose an arbitrary XOR mask for our pages */
    xor_mask = 0xEF;

    /* create an image writer to help us write the output file */
    writer = new CVmImageWriter(newfp);

    /* create our constant mapper */
    const_mapper = new CVmConstMapper(vmg0_);

    /* 
     *   clear all undo information - we don't save undo with the rebuilt
     *   file, so there's no reason to keep any of the objects that are
     *   referenced only in the undo records 
     */
    G_undo->drop_undo(vmg0_);

    /* discard everything on the stack */
    G_stk->discard(G_stk->get_depth());

    /* 
     *   perform a full garbage collection pass, to make sure we don't
     *   include any unreachable objects in the new image file 
     */
    G_obj_table->gc_full(vmg0_);

    /* add any metaclasses that weren't in the dependency table originally */
    G_obj_table->add_metadeps_for_instances(vmg0_);

    /* convert objects to constant data to the extent possible */
    G_obj_table->rebuild_image_convert_const_data(vmg_ const_mapper);

    /* 
     *   copy the header (signature, UINT2 format version number, 32
     *   reserved bytes, 24-byte compilation timestamp) to the new file 
     */
    origfp->read_bytes(buf, sizeof(VMIMAGE_SIG) - 1 + 2 + 32 + 24);
    newfp->write_bytes(buf, sizeof(VMIMAGE_SIG) - 1 + 2 + 32 + 24);

    /* copy or replace the data blocks */
    for (done = FALSE ; !done ; )
    {
        ulong siz;

        /* read the next block header */
        origfp->read_bytes(buf, 10);

        /* get the size */
        siz = t3rp4u(buf + 4);

        /* check the block type */
        if (CVmImageLoader::block_type_is(buf, "OBJS")
            || CVmImageLoader::block_type_is(buf, "MCLD")
            || CVmImageLoader::block_type_is(buf, "SINI"))
        {
            /* 
             *   Simply skip all of the original OBJS (object data) or
             *   MCLD (metaclass dependency table) blocks -- we'll replace
             *   them with our re-built blocks.
             *   
             *   Also skip SINI (static initializer) blocks, since these
             *   are only needed for pre-initialization and can be
             *   discarded from the final image file.  
             */
            origfp->set_pos(origfp->get_pos() + (long)siz);
        }
        else if (CVmImageLoader::block_type_is(buf, "CPDF"))
        {
            char cpdf_buf[20];
            uint pool_id;
            ulong pgcnt;
            ulong pgsiz;
            
            /* read the pool definition */
            origfp->read_bytes(cpdf_buf, 10);

            /* get the ID, page count, and page size from the definition */
            pool_id = osrp2(cpdf_buf);
            pgcnt = t3rp4u(cpdf_buf + 2);
            pgsiz = t3rp4u(cpdf_buf + 6);

            /* 
             *   if this is the constant pool (pool ID = 2), increase the
             *   page count by the extra constant pool pages we need for
             *   converting new object data to constants 
             */
            if (pool_id == 2)
            {
                /* add in our new count */
                pgcnt += const_mapper->get_page_count();

                /* write the new count */
                oswp4(cpdf_buf + 2, pgcnt);
            }

            /*
             *   if this is the code pool (pool ID = 1), and we have
             *   static initializers, decrease the page count to exclude
             *   the static initializer pages (all of the static
             *   initializers are grouped at the high end of the code
             *   pool, so we can discard them and only them by truncating
             *   the code pool before the page containing the first static
             *   initializer) 
             */
            if (pool_id == 1 && static_cs_ofs != 0)
            {
                /* 
                 *   calculate the new count - it's the offset to the
                 *   first static initializer divided by the size of each
                 *   code page 
                 */
                pgcnt = static_cs_ofs / pgsiz;
                
                /* write the new count */
                oswp4(cpdf_buf + 2, pgcnt);

                /* 
                 *   remember the code page size for later, when we're
                 *   scanning the code pages themselves 
                 */
                code_page_size = pgsiz;
            }
            
            /* update the constant block definition */
            newfp->write_bytes(buf, 10);
            newfp->write_bytes(cpdf_buf, 10);
        }
        else if (CVmImageLoader::block_type_is(buf, "CPPG"))
        {
            char cppg_buf[20];
            long start_pos;
            uint pool_id;
            ulong page_idx;
            int keep_block;

            /* presume we're going to keep this block */
            keep_block = TRUE;
            
            /* 
             *   This is a constant page - if it's in pool 2 (constants),
             *   use its XOR mask for any new pages we write.  First, read
             *   the pool header, then seek back so we can copy the block
             *   unchanged.  
             */
            start_pos = origfp->get_pos();
            origfp->read_bytes(cppg_buf, 7);
            origfp->set_pos(start_pos);

            /* get the pool ID and the page's index */
            pool_id = osrp2(cppg_buf);
            page_idx = t3rp4u(cppg_buf + 2);

            /* if it's pool 2 (constants), read its XOR mask byte */
            if (pool_id == 2)
                xor_mask = cppg_buf[6];

            /* 
             *   if it's pool 1 (code), and it's above the start of the
             *   static initializers, skip it - we don't want to copy
             *   static initializer code to the final image file, since
             *   they're only needed for static initialization, which we
             *   necessarily have finished by the time we reach this point 
             */
            if (pool_id == 1
                && static_cs_ofs != 0
                && page_idx * code_page_size >= static_cs_ofs)
            {
                /* this is a static initializer block - skip it */
                keep_block = FALSE;
            }

            /* keep or skip the block, as appropriate */
            if (keep_block)
            {
                /* 
                 *   we only wanted to get information from this block, so
                 *   go copy it as-is to the output 
                 */
                goto copy_block;
            }
            else
            {
                /* skip past the block */
                origfp->set_pos(origfp->get_pos() + (long)siz);
            }
        }
        else if (CVmImageLoader::block_type_is(buf, "EOF "))
        {
            /* end of file - note that we're done after this block */
            done = TRUE;

            /* re-write the metaclass dependency block */
            G_meta_table->rebuild_image(writer);

            /* write our new OBJS blocks */
            vm_rewrite_objs_blocks(vmg_ writer, const_mapper);

            /* write our new constant pool pages */
            const_mapper->write_to_image_file(writer, xor_mask);

            /* copy the EOF block to the new file unchanged */
            goto copy_block;
        }
        else
        {
        copy_block:
            /*
             *   For anything else, we'll simply copy the original block
             *   from the original image file unchanged. 
             */
            
            /* write the block header unchanged */
            newfp->write_bytes(buf, 10);

            /* copy the block in chunks */
            while (siz != 0)
            {
                size_t cur;

                /* 
                 *   read as much as we can, up to the amount remaining or
                 *   the buffer size, whichever is smaller 
                 */
                cur = sizeof(buf);
                if (cur > siz)
                    cur = (size_t)siz;

                /* read the data and write it out */
                origfp->read_bytes(buf, cur);
                newfp->write_bytes(buf, cur);

                /* deduct this chunk from the amount remaining */
                siz -= cur;
            }
        }
    }

    /* we're done with the image writer */
    delete writer;

    /* we're done with the constant mapper */
    delete const_mapper;
}